

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

int __thiscall Map<int,_int>::remove(Map<int,_int> *this,char *__filename)

{
  Item *pIVar1;
  long lVar2;
  bool bVar3;
  Iterator it;
  Item *local_8;
  
  local_8 = this->root;
  bVar3 = local_8 == (Item *)0x0;
  if (!bVar3) {
    bVar3 = false;
    do {
      lVar2 = 0x18;
      if ((*(int *)__filename <= local_8->key) && (lVar2 = 0x10, local_8->key <= *(int *)__filename)
         ) break;
      local_8 = *(Item **)((long)&local_8->key + lVar2);
      bVar3 = local_8 == (Item *)0x0;
    } while (!bVar3);
  }
  pIVar1 = (this->_end).item;
  if (bVar3) {
    local_8 = pIVar1;
  }
  if (local_8 != pIVar1) {
    remove(this,(char *)&local_8);
  }
  return (int)local_8;
}

Assistant:

void remove(const T& key)
  {
    Iterator it = find(key);
    if(it != _end)
      remove(it);
  }